

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmrun.cpp
# Opt level: O0

int CVmRun::get_prop_no_eval
              (vm_val_t **target_obj,vm_prop_id_t target_prop,uint *argc,vm_obj_id_t *srcobj,
              vm_val_t *val,vm_val_t **self,vm_val_t *new_self)

{
  int iVar1;
  vm_obj_id_t vVar2;
  char *pcVar3;
  CVmObject *pCVar4;
  undefined8 in_RCX;
  vm_obj_id_t *src_obj;
  undefined8 in_RDX;
  ushort in_SI;
  long *in_RDI;
  vm_val_t *in_R8;
  vm_val_t *in_R9;
  vm_val_t *in_stack_00000008;
  char *target_ptr;
  int found;
  uint *in_stack_ffffffffffffffb0;
  vm_val_t *pvVar5;
  CVmPoolInMem *in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffcc;
  
  src_obj = (vm_obj_id_t *)(ulong)(*(int *)*in_RDI - 1);
  switch(src_obj) {
  case (vm_obj_id_t *)0x0:
    err_throw(0);
  default:
    err_throw(0);
  case (vm_obj_id_t *)0x4:
    pCVar4 = vm_objp(0);
    iVar1 = (*pCVar4->_vptr_CVmObject[0xd])
                      (pCVar4,(ulong)in_SI,in_R8,(ulong)*(uint *)(*in_RDI + 8),in_RCX,in_RDX);
    if (**(int **)in_R9 != 5) {
      err_throw(0);
    }
    break;
  case (vm_obj_id_t *)0x7:
    if ((**(int **)in_R9 != *(int *)*in_RDI) ||
       (*(int *)(*(long *)in_R9 + 8) != *(int *)(*in_RDI + 8))) {
      err_throw(0);
    }
    pcVar3 = CVmPoolInMem::get_ptr(in_stack_ffffffffffffffc0,0);
    iVar1 = CVmObjString::const_get_prop
                      (in_R8,in_R9,
                       (char *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),
                       (vm_prop_id_t)((ulong)pcVar3 >> 0x30),src_obj,in_stack_ffffffffffffffb0);
    pvVar5 = in_stack_00000008;
    if ((iVar1 != 0) &&
       (((in_R8->typ == VM_CODEOFS || (in_R8->typ == VM_OBJX)) || (in_R8->typ == VM_BIFPTRX)))) {
      vVar2 = CVmObjStringConst::create((char *)in_stack_ffffffffffffffb0);
      vm_val_t::set_obj(pvVar5,vVar2);
      *(vm_val_t **)in_R9 = in_stack_00000008;
      *in_RDI = (long)in_stack_00000008;
    }
    break;
  case (vm_obj_id_t *)0x9:
    if ((**(int **)in_R9 != *(int *)*in_RDI) ||
       (*(int *)(*(long *)in_R9 + 8) != *(int *)(*in_RDI + 8))) {
      err_throw(0);
    }
    pcVar3 = CVmPoolInMem::get_ptr(in_stack_ffffffffffffffc0,0);
    iVar1 = CVmObjList::const_get_prop
                      (in_R8,in_R9,
                       (char *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),
                       (vm_prop_id_t)((ulong)pcVar3 >> 0x30),src_obj,in_stack_ffffffffffffffb0);
    if ((iVar1 != 0) &&
       (((in_R8->typ == VM_CODEOFS || (in_R8->typ == VM_OBJX)) || (in_R8->typ == VM_BIFPTRX)))) {
      pvVar5 = in_stack_00000008;
      vVar2 = CVmObjListConst::create((char *)in_stack_00000008);
      vm_val_t::set_obj(pvVar5,vVar2);
      *(vm_val_t **)in_R9 = in_stack_00000008;
      *in_RDI = (long)in_stack_00000008;
    }
  }
  return iVar1;
}

Assistant:

inline int CVmRun::get_prop_no_eval(VMG_ const vm_val_t **target_obj,
                                    vm_prop_id_t target_prop,
                                    uint *argc, vm_obj_id_t *srcobj,
                                    vm_val_t *val,
                                    const vm_val_t **self,
                                    vm_val_t *new_self)
{
    int found;
    const char *target_ptr;
    
    /* 
     *   we can evaluate properties of regular objects, as well as string
     *   and list constants - see what we have 
     */
    switch((*target_obj)->typ)
    {
    case VM_LIST:
        /* 'self' must be the same as the target for a constant list */
        if ((*self)->typ != (*target_obj)->typ
            || (*self)->val.ofs != (*target_obj)->val.ofs)
            err_throw(VMERR_OBJ_VAL_REQD);

        /* translate the list offset to a physical pointer */
        target_ptr = G_const_pool->get_ptr((*target_obj)->val.ofs);

        /* evaluate the constant list property */
        found = CVmObjList::const_get_prop(vmg_ val, *target_obj,
                                           target_ptr, target_prop,
                                           srcobj, argc);

        /* 
         *   If the result is a method to run, we need an actual object for
         *   'self'.  In this case, create a dynamic list object with the
         *   same contents as the constant list value.  
         */
        if (found
            && (val->typ == VM_CODEOFS
                || val->typ == VM_OBJX
                || val->typ == VM_BIFPTRX))
        {
            /* create the list */
            new_self->set_obj(CVmObjListConst::create(vmg_ target_ptr));

            /* use it as the new 'self' and the new effective target */
            *self = new_self;
            *target_obj = new_self;
        }

        /* go evaluate the result as normal */
        break;

    case VM_SSTRING:
        /* 'self' must be the same as the target for a constant string */
        if ((*self)->typ != (*target_obj)->typ
            || (*self)->val.ofs != (*target_obj)->val.ofs)
            err_throw(VMERR_OBJ_VAL_REQD);

        /* translate the string offset to a physical pointer */
        target_ptr = G_const_pool->get_ptr((*target_obj)->val.ofs);

        /* evaluate the constant string property */
        found = CVmObjString::const_get_prop(vmg_ val, *target_obj,
                                             target_ptr, target_prop,
                                             srcobj, argc);

        /* 
         *   If the result is a method to run, we need an actual object for
         *   'self'.  In this case, create a dynamic string object with the
         *   same contents as the constant string value.  
         */
        if (found
            && (val->typ == VM_CODEOFS
                || val->typ == VM_OBJX
                || val->typ == VM_BIFPTRX))
        {
            /* create the string */
            new_self->set_obj(CVmObjStringConst::create(vmg_ target_ptr));

            /* it's the new 'self' and the new effective target object */
            *self = new_self;
            *target_obj = new_self;
        }

        /* go evaluate the result as normal */
        break;

    case VM_OBJ:
        /* get the property value from the target object */
        found = vm_objp(vmg_ (*target_obj)->val.obj)
                ->get_prop(vmg_ target_prop, val, (*target_obj)->val.obj,
                           srcobj, argc);

        /* 'self' must be an object as well */
        if ((*self)->typ != VM_OBJ)
            err_throw(VMERR_OBJ_VAL_REQD);
        break;

    case VM_NIL:
        /* nil pointer dereferenced */
        err_throw(VMERR_NIL_DEREF);

    default:
        /* we can't evaluate properties of anything else */
        err_throw(VMERR_OBJ_VAL_REQD);
    }

    /* return the 'found' indication */
    return found;
}